

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatTest_WideFormatToN_Test::TestBody(FormatTest_WideFormatToN_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  AssertHelper *this_00;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  type result;
  wchar_t buffer [4];
  basic_string_view<wchar_t> *in_stack_fffffffffffffef0;
  wchar_t **in_stack_fffffffffffffef8;
  basic_string_view<wchar_t> *this_01;
  char *in_stack_ffffffffffffff00;
  AssertionResult *pAVar3;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  int line;
  char *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  Type TVar4;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  wchar_t (*in_stack_ffffffffffffff40) [3];
  size_t in_stack_ffffffffffffff48;
  wchar_t *in_stack_ffffffffffffff50;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff68;
  AssertHelper *in_stack_ffffffffffffff70;
  AssertionResult local_78 [3];
  undefined4 local_44;
  AssertionResult local_40;
  undefined4 local_2c;
  type local_28;
  wchar_t local_18 [3];
  undefined4 local_c;
  
  TVar4 = (Type)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  local_c = 0x78;
  local_2c = 0x3039;
  local_28 = fmt::v5::format_to_n<wchar_t*,wchar_t[3],int>
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                        in_stack_ffffffffffffff40,
                        (int *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  local_44 = 5;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             in_stack_ffffffffffffff00,(uint *)in_stack_fffffffffffffef8,
             (unsigned_long *)in_stack_fffffffffffffef0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_40);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    testing::AssertionResult::failure_message((AssertionResult *)0x1827f5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),TVar4,
               in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff70,(Message *)in_stack_ffffffffffffff68.ptr_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffef0);
    testing::Message::~Message((Message *)0x182852);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1828a7);
  pAVar3 = local_78;
  testing::internal::EqHelper<false>::Compare<wchar_t*,wchar_t*>
            ((char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,&in_stack_fffffffffffffef0->data_);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  TVar4 = (Type)((ulong)pAVar3 >> 0x20);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_ffffffffffffff20));
    in_stack_ffffffffffffff10 =
         testing::AssertionResult::failure_message((AssertionResult *)0x18294d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffff20),TVar4,
               in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff70,(Message *)in_stack_ffffffffffffff68.ptr_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffef0);
    testing::Message::~Message((Message *)0x1829aa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1829ff);
  this_01 = (basic_string_view<wchar_t> *)&stack0xffffffffffffff50;
  fmt::v5::basic_string_view<wchar_t>::basic_string_view(this_01,local_18,4);
  pAVar3 = (AssertionResult *)&stack0xffffffffffffff60;
  testing::internal::EqHelper<false>::Compare<wchar_t[5],fmt::v5::basic_string_view<wchar_t>>
            ((char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),(char *)pAVar3,
             (wchar_t (*) [5])this_01,in_stack_fffffffffffffef0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  line = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff0c);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_ffffffffffffff20));
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x182aa4)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffff20),TVar4,
               in_stack_ffffffffffffff10,line,&pAVar3->success_);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff70,(Message *)in_stack_ffffffffffffff68.ptr_);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x182af2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x182b3e);
  return;
}

Assistant:

TEST(FormatTest, WideFormatToN) {
  wchar_t buffer[4];
  buffer[3] = L'x';
  auto result = fmt::format_to_n(buffer, 3, L"{}", 12345);
  EXPECT_EQ(5u, result.size);
  EXPECT_EQ(buffer + 3, result.out);
  EXPECT_EQ(L"123x", fmt::wstring_view(buffer, 4));
}